

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_device_uninit(ma_device *pDevice)

{
  anon_union_96_2_0c88ee4f_for_ma_event_1 *paVar1;
  void *pvVar2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_context *pmVar4;
  
  if ((pDevice != (ma_device *)0x0) && (pDevice->state != 0)) {
    if (pDevice->state == 2) {
      ma_device_stop(pDevice);
    }
    LOCK();
    pDevice->state = 0;
    UNLOCK();
    pmVar4 = pDevice->pContext;
    if ((pmVar4->field_0xb8 & 1) == 0) {
      pmVar4 = (pDevice->wakeupEvent).pContext;
      if (pmVar4 != (ma_context *)0x0) {
        paVar1 = &(pDevice->wakeupEvent).field_1;
        (*(pmVar4->field_22).posix.pthread_mutex_lock)(paVar1);
        (pDevice->wakeupEvent).field_1.posix.value = 1;
        (*(((pDevice->wakeupEvent).pContext)->field_22).posix.pthread_cond_signal)
                  ((undefined1 *)((long)&(pDevice->wakeupEvent).field_1 + 0x28));
        (*(((pDevice->wakeupEvent).pContext)->field_22).posix.pthread_mutex_unlock)(paVar1);
      }
      (*(((pDevice->thread).pContext)->field_22).posix.pthread_join)((pDevice->thread).field_1);
      pmVar4 = pDevice->pContext;
    }
    (*pmVar4->onDeviceUninit)(pDevice);
    pmVar4 = (pDevice->stopEvent).pContext;
    if (pmVar4 != (ma_context *)0x0) {
      (*(pmVar4->field_22).posix.pthread_cond_destroy)
                ((undefined1 *)((long)&(pDevice->stopEvent).field_1 + 0x28));
      (*(((pDevice->stopEvent).pContext)->field_22).posix.pthread_mutex_destroy)
                (&(pDevice->stopEvent).field_1);
    }
    pmVar4 = (pDevice->startEvent).pContext;
    if (pmVar4 != (ma_context *)0x0) {
      (*(pmVar4->field_22).posix.pthread_cond_destroy)
                ((undefined1 *)((long)&(pDevice->startEvent).field_1 + 0x28));
      (*(((pDevice->startEvent).pContext)->field_22).posix.pthread_mutex_destroy)
                (&(pDevice->startEvent).field_1);
    }
    pmVar4 = (pDevice->wakeupEvent).pContext;
    if (pmVar4 != (ma_context *)0x0) {
      (*(pmVar4->field_22).posix.pthread_cond_destroy)
                ((undefined1 *)((long)&(pDevice->wakeupEvent).field_1 + 0x28));
      (*(((pDevice->wakeupEvent).pContext)->field_22).posix.pthread_mutex_destroy)
                (&(pDevice->wakeupEvent).field_1);
    }
    pmVar4 = (pDevice->lock).pContext;
    if (pmVar4 != (ma_context *)0x0) {
      (*(pmVar4->field_22).posix.pthread_mutex_destroy)(&(pDevice->lock).field_1);
    }
    if ((pDevice->field_0x1ac & 8) != 0) {
      pmVar4 = pDevice->pContext;
      pvVar2 = (pmVar4->allocationCallbacks).pUserData;
      p_Var3 = (pmVar4->allocationCallbacks).onFree;
      ma_context_uninit(pmVar4);
      if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0 && pDevice->pContext != (ma_context *)0x0) {
        (*p_Var3)(pDevice->pContext,pvVar2);
      }
    }
    memset(pDevice,0,0x55d0);
    return;
  }
  return;
}

Assistant:

static ma_bool32 ma_device__is_initialized(ma_device* pDevice)
{
    if (pDevice == NULL) {
        return MA_FALSE;
    }

    return ma_device__get_state(pDevice) != MA_STATE_UNINITIALIZED;
}